

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellANCF_3423::Layer::SetupInitial(Layer *this)

{
  double *pdVar1;
  ChElementShellANCF_3423 *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  double dVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  ChMatrixNM<double,_3,_3> j0;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_8> Ny;
  double local_260;
  double local_250;
  double local_240;
  undefined1 local_1f8 [16];
  double dStack_1e8;
  ulong uStack_1e0;
  undefined1 local_1d8 [16];
  ulong local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  double local_1a0;
  double local_190;
  double dStack_188;
  double dStack_180;
  double local_170;
  double dStack_168;
  double dStack_160;
  double local_158;
  double local_150;
  double dStack_148;
  undefined1 local_140 [64];
  ShapeVector local_100;
  undefined1 local_c0 [2] [64];
  undefined1 auVar44 [32];
  undefined1 auVar52 [32];
  undefined1 auVar81 [32];
  undefined1 auVar88 [32];
  
  this_00 = this->m_element;
  auVar45._8_8_ = 0x3fd0000000000000;
  auVar45._0_8_ = 0x3fd0000000000000;
  auVar52._16_8_ = 0x3fd0000000000000;
  auVar52._0_16_ = auVar45;
  auVar52._24_8_ = 0x3fd0000000000000;
  auVar7._8_8_ = this_00->m_lenX;
  auVar7._0_8_ = this_00->m_lenX;
  auVar7 = vdivpd_avx512vl(_DAT_00ef8be0,auVar7);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = this_00->m_thickness * 0.0 * 0.5 * 0.25;
  auVar2 = vunpcklpd_avx(auVar45,auVar24);
  auVar44 = vblendpd_avx(auVar52,ZEXT1632(auVar2),3);
  auVar44 = vpermpd_avx2(auVar44,100);
  auVar52 = vpermpd_avx2(ZEXT1632(auVar7),0x50);
  auVar32 = ZEXT3264(CONCAT824(auVar52._24_8_ * auVar44._24_8_,
                               CONCAT816(auVar52._16_8_ * auVar44._16_8_,
                                         CONCAT88(auVar52._8_8_ * auVar44._8_8_,
                                                  auVar52._0_8_ * auVar44._0_8_))));
  local_c0[0] = vshuff64x2_avx512f(auVar32,auVar32,0x14);
  ShapeFunctionsDerivativeY(this_00,&local_100,0.0,auVar52._0_8_,0.0);
  local_140 = vbroadcastf32x4_avx512f(_DAT_00eeb130);
  local_1f8._8_8_ = &this_00->m_d0;
  local_1f8._0_8_ = local_c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_170,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
              *)local_1f8);
  local_1f8._8_8_ = &this->m_element->m_d0;
  local_1f8._0_8_ = &local_100;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_190,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
              *)local_1f8);
  local_1f8._8_8_ = &this->m_element->m_d0;
  local_1f8._0_8_ = local_140;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_158,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
              *)local_1f8);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_190;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_170;
  auVar12._8_8_ = dStack_180;
  auVar12._0_8_ = dStack_188;
  auVar82._8_8_ = dStack_160;
  auVar82._0_8_ = dStack_160;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dStack_148;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_158;
  auVar16._8_8_ = dStack_160;
  auVar16._0_8_ = dStack_168;
  auVar85._8_8_ = dStack_180;
  auVar85._0_8_ = dStack_180;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dStack_160 * local_190 * local_150;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_170 * dStack_188;
  auVar2 = vfmadd231sd_fma(auVar65,auVar34,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dStack_168 * local_158;
  auVar7 = vfmadd213sd_fma(auVar75,auVar85,auVar2);
  auVar2 = vunpcklpd_avx(auVar82,auVar25);
  auVar66._0_8_ = dStack_188 * -auVar2._0_8_;
  auVar66._8_8_ = dStack_180 * -auVar2._8_8_;
  auVar2 = vfmadd231sd_fma(auVar7,auVar66,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dStack_180 * local_150;
  auVar2 = vfnmadd213sd_fma(auVar56,auVar25,auVar2);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dStack_168 * dStack_148;
  auVar2 = vfnmadd213sd_fma(auVar35,auVar46,auVar2);
  this->m_detJ0C = auVar2._0_8_;
  auVar2 = vunpcklpd_avx(auVar85,auVar46);
  local_1b0 = vfmadd213pd_fma(auVar2,auVar16,auVar66);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dStack_168 * local_190;
  auVar2 = vfmsub231sd_fma(auVar36,auVar25,auVar12);
  local_1a0 = auVar2._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dStack_168 * dStack_168;
  auVar2 = vfmadd231sd_fma(auVar37,auVar25,auVar25);
  auVar2 = vfmadd231sd_fma(auVar2,auVar82,auVar82);
  auVar2 = vsqrtsd_avx(auVar2,auVar2);
  dVar33 = 1.0 / auVar2._0_8_;
  dVar78 = local_170 * dVar33;
  dVar89 = dStack_168 * dVar33;
  dVar33 = dStack_160 * dVar33;
  ChVector<double>::GetNormalized((ChVector<double> *)local_1f8,(ChVector<double> *)local_1b0);
  auVar26._8_8_ = dStack_1e8;
  auVar26._0_8_ = dStack_1e8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar89;
  auVar47._8_8_ = local_1f8._8_8_;
  auVar47._0_8_ = local_1f8._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar33;
  auVar38._8_8_ = local_1f8._0_8_;
  auVar38._0_8_ = local_1f8._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar89 * dStack_1e8;
  auVar4 = vfmsub231sd_fma(auVar67,auVar47,auVar4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar78;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar33 * (double)local_1f8._0_8_;
  auVar8 = vfmsub231sd_fma(auVar68,auVar26,auVar3);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar78 * (double)local_1f8._8_8_;
  auVar9 = vfmsub231sd_fma(auVar27,auVar38,auVar11);
  dVar20 = cos(this->m_theta);
  dVar21 = sin(this->m_theta);
  dVar22 = sin(this->m_theta);
  dVar23 = cos(this->m_theta);
  auVar39._8_8_ = local_158;
  auVar39._0_8_ = local_158;
  auVar44._16_8_ = local_158;
  auVar44._0_16_ = auVar39;
  auVar44._24_8_ = local_158;
  auVar76._8_8_ = dStack_148;
  auVar76._0_8_ = dStack_148;
  auVar5._8_8_ = dStack_148;
  auVar5._0_8_ = local_150;
  auVar15._8_8_ = dStack_168;
  auVar15._0_8_ = local_170;
  auVar86._8_8_ = dStack_180;
  auVar86._0_8_ = dStack_180;
  auVar88._16_8_ = dStack_180;
  auVar88._0_16_ = auVar86;
  auVar88._24_8_ = dStack_180;
  auVar83._8_8_ = dStack_188;
  auVar83._0_8_ = dStack_188;
  auVar92._8_8_ = dStack_148;
  auVar92._0_8_ = dStack_148;
  auVar92._16_8_ = dStack_148;
  auVar92._24_8_ = dStack_148;
  auVar44 = vblendpd_avx(ZEXT1632(auVar5),auVar44,4);
  auVar2 = vunpcklpd_avx(auVar39,auVar5);
  auVar7 = vunpcklpd_avx(auVar39,auVar15);
  auVar3 = vunpcklpd_avx(auVar76,auVar39);
  auVar14._8_8_ = dStack_188;
  auVar14._0_8_ = local_190;
  auVar31._8_8_ = dStack_160;
  auVar31._0_8_ = dStack_160;
  auVar31._16_8_ = dStack_160;
  auVar31._24_8_ = dStack_160;
  auVar11 = vunpcklpd_avx(auVar83,auVar86);
  auVar52 = vblendpd_avx(ZEXT1632(auVar11),auVar92,0xc);
  auVar73 = vpermpd_avx2(auVar44,0x24);
  auVar80._16_16_ = auVar14;
  auVar80._0_16_ = auVar2;
  auVar53._16_16_ = auVar15;
  auVar53._0_16_ = auVar2;
  auVar44 = vblendpd_avx(ZEXT1632(auVar14),auVar88,4);
  auVar44 = vblendpd_avx(auVar44,auVar31,8);
  auVar61._0_8_ = -dStack_160;
  auVar61._8_8_ = -dStack_160;
  auVar31 = vblendpd_avx(auVar80,auVar53,10);
  auVar79._0_8_ = -auVar31._0_8_;
  auVar79._8_8_ = -auVar31._8_8_;
  auVar81._16_8_ = -auVar31._16_8_;
  auVar81._0_16_ = auVar79;
  auVar81._24_8_ = -auVar31._24_8_;
  auVar54._0_8_ = auVar52._0_8_ * auVar31._0_8_;
  auVar54._8_8_ = auVar52._8_8_ * auVar31._8_8_;
  auVar54._16_8_ = auVar52._16_8_ * auVar31._16_8_;
  auVar54._24_8_ = auVar52._24_8_ * auVar31._24_8_;
  auVar2 = vfmsub231pd_fma(auVar54,auVar73,auVar44);
  _local_1f8 = vpermpd_avx2(ZEXT1632(auVar2),0xc9);
  auVar2 = vblendpd_avx(auVar61,auVar79,2);
  auVar62._0_8_ = -local_170;
  auVar62._8_8_ = -dStack_168;
  auVar48._0_8_ = auVar7._0_8_ * auVar2._0_8_;
  auVar48._8_8_ = auVar7._8_8_ * auVar2._8_8_;
  auVar7 = vunpcklpd_avx(auVar62,auVar81._16_16_);
  local_1d8 = vfmadd231pd_fma(auVar48,auVar15,auVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dStack_168;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dStack_188 * dStack_160;
  auVar2 = vfmsub231sd_fma(auVar49,auVar86,auVar2);
  auVar28._8_8_ = local_170;
  auVar28._0_8_ = dStack_160;
  local_1c8 = auVar2._0_8_;
  auVar50._0_8_ = dStack_180 * auVar7._0_8_;
  auVar50._8_8_ = dStack_168 * auVar7._8_8_;
  local_1c0 = vfmadd213pd_fma(auVar28,auVar14,auVar50);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1f8,&this->m_detJ0C);
  auVar10._8_8_ = extraout_XMM0_Qb_00;
  auVar10._0_8_ = dVar21;
  local_250 = auVar4._0_8_;
  local_240 = auVar8._0_8_;
  local_260 = auVar9._0_8_;
  auVar13._8_8_ = extraout_XMM0_Qb;
  auVar13._0_8_ = dVar20;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_1c0._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = local_1f8._8_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_1c8;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = local_1f8._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_1c0._8_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dStack_1e8;
  auVar8._8_8_ = extraout_XMM0_Qb_02;
  auVar8._0_8_ = dVar23;
  auVar2 = vunpcklpd_avx(auVar10,auVar8);
  auVar9._8_8_ = extraout_XMM0_Qb_01;
  auVar9._0_8_ = dVar22;
  auVar7 = vunpcklpd_avx(auVar13,auVar9);
  dVar20 = auVar2._0_8_;
  auVar29._0_8_ = local_250 * dVar20;
  dVar21 = auVar2._8_8_;
  auVar29._8_8_ = local_250 * dVar21;
  auVar69._0_8_ = local_240 * dVar20;
  auVar69._8_8_ = local_240 * dVar21;
  auVar40._0_8_ = local_260 * dVar20;
  auVar40._8_8_ = local_260 * dVar21;
  dVar20 = auVar7._0_8_;
  auVar71._0_8_ = dVar78 * dVar20;
  dVar21 = auVar7._8_8_;
  auVar71._8_8_ = dVar78 * dVar21;
  dVar78 = auVar29._0_8_ + auVar71._0_8_;
  auVar7 = vsubpd_avx(auVar29,auVar71);
  auVar30._8_8_ = auVar7._8_8_;
  auVar30._0_8_ = dVar78;
  auVar72._0_8_ = dVar89 * dVar20;
  auVar72._8_8_ = dVar89 * dVar21;
  auVar77._0_8_ = dVar33 * dVar20;
  auVar77._8_8_ = dVar33 * dVar21;
  dVar21 = auVar69._0_8_ + auVar72._0_8_;
  auVar3 = vsubpd_avx(auVar69,auVar72);
  dVar89 = auVar40._0_8_ + auVar77._0_8_;
  auVar11 = vsubpd_avx(auVar40,auVar77);
  auVar4 = vunpcklpd_avx(auVar57,auVar95);
  auVar2 = vshufpd_avx(auVar3,auVar3,3);
  auVar90._8_8_ = auVar11._8_8_;
  auVar90._0_8_ = dVar89;
  auVar41._0_8_ = dVar21 * auVar4._0_8_;
  auVar41._8_8_ = auVar3._8_8_ * auVar4._8_8_;
  auVar3 = vunpcklpd_avx(auVar51,auVar93);
  auVar4 = vfmadd213pd_fma(auVar3,auVar30,auVar41);
  auVar8 = vmulsd_avx512f(auVar47,auVar57);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = local_1d8._0_8_;
  auVar9 = vunpcklpd_avx512vl(auVar98,auVar57);
  auVar3 = vunpcklpd_avx(auVar63,auVar96);
  auVar58._0_8_ = auVar2._0_8_ * auVar9._0_8_;
  auVar58._8_8_ = auVar2._8_8_ * auVar9._8_8_;
  auVar2 = vshufpd_avx(auVar7,auVar7,3);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uStack_1e0;
  auVar7 = vunpcklpd_avx512vl(auVar97,auVar51);
  auVar9 = vfmadd231sd_avx512f(auVar8,auVar38,auVar51);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = local_1d8._8_8_;
  auVar10 = vunpcklpd_avx512vl(auVar99,auVar63);
  auVar7 = vfmadd213pd_fma(auVar7,auVar2,auVar58);
  auVar2 = vshufpd_avx(auVar11,auVar11,3);
  auVar11 = vunpcklpd_avx512vl(auVar95,auVar98);
  auVar8 = vfmadd213pd_fma(auVar3,auVar90,auVar4);
  auVar32 = vbroadcasti64x4_avx512f(_DAT_00ecf300);
  auVar12 = vfmadd231sd_avx512f(auVar9,auVar26,auVar63);
  auVar64._8_8_ = dVar78;
  auVar64._0_8_ = dVar78;
  auVar9 = vfmadd213pd_fma(auVar10,auVar2,auVar7);
  auVar13 = vunpcklpd_avx512vl(auVar93,auVar97);
  auVar14 = vunpcklpd_avx512vl(auVar96,auVar99);
  dVar20 = auVar8._0_8_;
  auVar59._0_8_ = dVar21 * auVar11._0_8_;
  auVar59._8_8_ = dVar21 * auVar11._8_8_;
  auVar2 = vshufpd_avx(auVar8,auVar9,1);
  auVar44 = vpermpd_avx2(ZEXT1632(auVar9),0x54);
  auVar3 = vfmadd213pd_fma(auVar64,auVar13,auVar59);
  auVar60._8_8_ = dVar89;
  auVar60._0_8_ = dVar89;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = (dVar20 + dVar20) * auVar12._0_8_;
  auVar7 = vshufpd_avx(auVar8,auVar8,1);
  auVar15 = vmulsd_avx512f(auVar7,auVar8);
  auVar10 = vfmadd213pd_fma(auVar60,auVar14,auVar3);
  dVar21 = auVar10._0_8_ + auVar10._0_8_;
  dVar78 = auVar10._8_8_ + auVar10._8_8_;
  auVar3 = vshufpd_avx(auVar10,auVar10,1);
  auVar17 = vpermi2pd_avx512f(auVar32,ZEXT1664(auVar10),ZEXT1664(auVar8));
  dVar22 = auVar2._0_8_;
  dVar23 = auVar2._8_8_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = auVar3._0_8_ * auVar7._0_8_;
  auVar4 = vfmadd231sd_fma(auVar94,auVar10,auVar9);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xc] = dVar22 * dVar21;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xd] = dVar23 * dVar78;
  auVar11 = vmulpd_avx512vl(auVar47,auVar11);
  auVar11 = vfmadd231pd_avx512vl(auVar11,auVar38,auVar13);
  auVar16 = vfmadd231pd_avx512vl(auVar11,auVar26,auVar14);
  dVar89 = auVar16._0_8_;
  auVar11 = vshufpd_avx(auVar16,auVar16,1);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar89 * auVar3._0_8_;
  auVar13 = vfmadd231sd_fma(auVar87,auVar10,auVar11);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = auVar7._0_8_ * auVar11._0_8_;
  auVar14 = vfmadd231sd_fma(auVar84,auVar16,auVar9);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = auVar13._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = dVar89 * (dVar22 + dVar22);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = auVar16._8_8_ * (dVar23 + dVar23);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xe] = auVar4._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = auVar14._0_8_;
  auVar32 = _DAT_00ef8cc0;
  auVar4 = vshufpd_avx(auVar9,auVar9,1);
  dVar33 = auVar4._0_8_;
  auVar13 = vfmadd231sd_avx512f(auVar15,auVar10,auVar4);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xf] = dVar33 * (dVar20 + dVar20);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar89 * dVar33;
  auVar7 = vfmadd231sd_fma(auVar91,auVar12,auVar7);
  auVar18 = vpermi2pd_avx512f(auVar32,auVar17,ZEXT1664(auVar9));
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = (dVar33 + dVar33) * auVar12._0_8_;
  auVar32 = _DAT_00ef8d00;
  pdVar1 = (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
           m_data.array + 0x10;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = auVar7._0_8_;
  auVar6 = _DAT_00ef8dc0;
  auVar17 = _DAT_00ef8d80;
  auVar19 = vpermpd_avx512f(_DAT_00ef8d40,auVar18);
  auVar32 = vpermpd_avx512f(auVar32,auVar18);
  auVar32 = vmulpd_avx512f(auVar32,auVar19);
  *(undefined1 (*) [64])
   (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       = auVar32;
  auVar7 = vunpckhpd_avx(auVar8,auVar9);
  auVar73._16_16_ = auVar2;
  auVar73._0_16_ = auVar7;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [8] = auVar7._0_8_ * auVar44._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [9] = auVar7._8_8_ * auVar44._8_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [10] = dVar22 * auVar44._16_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = dVar23 * auVar44._24_8_;
  auVar42._0_8_ = dVar89 * dVar20;
  auVar42._8_8_ = auVar16._8_8_ * dVar20;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = auVar9._0_8_ * dVar20;
  auVar2 = vfmadd231sd_fma(auVar70,auVar4,auVar3);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = auVar2._0_8_;
  auVar32 = vbroadcastsd_avx512f(auVar12);
  auVar18 = vblendmpd_avx512f(ZEXT1664(auVar16),auVar32);
  auVar18 = ZEXT3264(CONCAT824(auVar18._24_8_,auVar73._0_24_));
  auVar2 = vfmadd213pd_fma(auVar32._0_16_,auVar10,auVar42);
  auVar32 = vpermpd_avx512f(auVar17,auVar18);
  auVar17 = vpermi2pd_avx512f(auVar6,auVar18,ZEXT1664(CONCAT88(dVar78,dVar21)));
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar33 * auVar11._0_8_;
  auVar7 = vfmadd231sd_fma(auVar43,auVar12,auVar9);
  auVar32 = vmulpd_avx512f(auVar32,auVar17);
  *(undefined1 (*) [64])
   ((this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x12) = auVar32;
  *(undefined1 (*) [16])
   ((this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x1c) = auVar2;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = auVar7._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3423::Layer::SetupInitial() {
    // Evaluate shape functions at element center
    ChMatrixNM<double, 1, 8> Nx;
    ChMatrixNM<double, 1, 8> Ny;
    ChMatrixNM<double, 1, 8> Nz;
    m_element->ShapeFunctionsDerivativeX(Nx, 0, 0, 0);
    m_element->ShapeFunctionsDerivativeY(Ny, 0, 0, 0);
    m_element->ShapeFunctionsDerivativeZ(Nz, 0, 0, 0);

    ChMatrixNM<double, 1, 3> Nx_d0 = Nx * m_element->m_d0;
    ChMatrixNM<double, 1, 3> Ny_d0 = Ny * m_element->m_d0;
    ChMatrixNM<double, 1, 3> Nz_d0 = Nz * m_element->m_d0;

    // Determinant of position vector gradient matrix: Initial configuration
    m_detJ0C = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
               Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
               Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    //// Transformation : Orthogonal transformation (A and J) ////
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(m_theta) + A2 * sin(m_theta);
    AA2 = -A1 * sin(m_theta) + A2 * cos(m_theta);
    AA3 = A3;

    ////Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    ChVectorN<double, 9> beta;

    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= m_detJ0C;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Calculate T0: transformation matrix, function of fiber angle (see Yamashita et al, 2015, JCND)
    m_T0(0, 0) = pow(beta(0), 2);
    m_T0(1, 0) = pow(beta(1), 2);
    m_T0(2, 0) = 2.0 * beta(0) * beta(1);
    m_T0(3, 0) = pow(beta(2), 2);
    m_T0(4, 0) = 2.0 * beta(0) * beta(2);
    m_T0(5, 0) = 2.0 * beta(1) * beta(2);

    m_T0(0, 1) = pow(beta(3), 2);
    m_T0(1, 1) = pow(beta(4), 2);
    m_T0(2, 1) = 2.0 * beta(3) * beta(4);
    m_T0(3, 1) = pow(beta(5), 2);
    m_T0(4, 1) = 2.0 * beta(3) * beta(5);
    m_T0(5, 1) = 2.0 * beta(4) * beta(5);

    m_T0(0, 2) = beta(0) * beta(3);
    m_T0(1, 2) = beta(1) * beta(4);
    m_T0(2, 2) = beta(0) * beta(4) + beta(1) * beta(3);
    m_T0(3, 2) = beta(2) * beta(5);
    m_T0(4, 2) = beta(0) * beta(5) + beta(2) * beta(3);
    m_T0(5, 2) = beta(2) * beta(4) + beta(1) * beta(5);

    m_T0(0, 3) = pow(beta(6), 2);
    m_T0(1, 3) = pow(beta(7), 2);
    m_T0(2, 3) = 2.0 * beta(6) * beta(7);
    m_T0(3, 3) = pow(beta(8), 2);
    m_T0(4, 3) = 2.0 * beta(6) * beta(8);
    m_T0(5, 3) = 2.0 * beta(7) * beta(8);

    m_T0(0, 4) = beta(0) * beta(6);
    m_T0(1, 4) = beta(1) * beta(7);
    m_T0(2, 4) = beta(0) * beta(7) + beta(6) * beta(1);
    m_T0(3, 4) = beta(2) * beta(8);
    m_T0(4, 4) = beta(0) * beta(8) + beta(2) * beta(6);
    m_T0(5, 4) = beta(1) * beta(8) + beta(2) * beta(7);

    m_T0(0, 5) = beta(3) * beta(6);
    m_T0(1, 5) = beta(4) * beta(7);
    m_T0(2, 5) = beta(3) * beta(7) + beta(4) * beta(6);
    m_T0(3, 5) = beta(5) * beta(8);
    m_T0(4, 5) = beta(3) * beta(8) + beta(6) * beta(5);
    m_T0(5, 5) = beta(4) * beta(8) + beta(5) * beta(7);
}